

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::ShowMetricsWindow::Funcs::GetWindowRect(ImGuiWindow *window,int rect_type)

{
  float fVar1;
  float fVar2;
  ImRect IVar3;
  ImRect IVar4;
  
  switch(rect_type) {
  case 0:
    IVar3.Max.x = (window->Pos).x + (window->Size).x;
    IVar3.Max.y = (window->Pos).y + (window->Size).y;
    IVar3.Min = window->Pos;
    return IVar3;
  case 1:
    return window->OuterRectClipped;
  case 2:
    return window->InnerRect;
  case 3:
    return window->InnerClipRect;
  case 4:
    return window->WorkRect;
  case 5:
    fVar1 = ((window->InnerRect).Min.x - (window->Scroll).x) + (window->WindowPadding).x;
    fVar2 = ((window->InnerRect).Min.y - (window->Scroll).y) + (window->WindowPadding).y;
    IVar4.Max.x = fVar1 + (window->ContentSize).x;
    IVar4.Min.y = fVar2;
    IVar4.Min.x = fVar1;
    IVar4.Max.y = fVar2 + (window->ContentSize).y;
    return IVar4;
  case 6:
    return window->ContentRegionRect;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x26ac,
                  "static ImRect ImGui::ShowMetricsWindow(bool *)::Funcs::GetWindowRect(ImGuiWindow *, int)"
                 );
  }
}

Assistant:

static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }